

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkSamplerMipmapMode Diligent::FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)

{
  uint uVar1;
  undefined7 in_register_00000039;
  string msg;
  string local_30;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,FilterType);
  if (uVar1 < 0xd) {
    if ((0x1b6cU >> (uVar1 & 0x1f) & 1) != 0) {
      return VK_SAMPLER_MIPMAP_MODE_LINEAR;
    }
    if ((0x492U >> (uVar1 & 0x1f) & 1) != 0) {
      return VK_SAMPLER_MIPMAP_MODE_NEAREST;
    }
    FormatString<char[20]>(&local_30,(char (*) [20])"Unknown filter type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FilterTypeToVkMipmapMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x47c);
  }
  else {
    FormatString<char[63]>
              (&local_30,
               (char (*) [63])"Only point and linear filter types are allowed for mipmap mode");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FilterTypeToVkMipmapMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x490);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return VK_SAMPLER_MIPMAP_MODE_NEAREST;
}

Assistant:

VkSamplerMipmapMode FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)
{
    switch (FilterType)
    {
        case FILTER_TYPE_UNKNOWN:
            UNEXPECTED("Unknown filter type");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_POINT:
        case FILTER_TYPE_COMPARISON_POINT:
        case FILTER_TYPE_MINIMUM_POINT:
        case FILTER_TYPE_MAXIMUM_POINT:
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_LINEAR:
        case FILTER_TYPE_ANISOTROPIC:
        case FILTER_TYPE_COMPARISON_LINEAR:
        case FILTER_TYPE_COMPARISON_ANISOTROPIC:
        case FILTER_TYPE_MINIMUM_LINEAR:
        case FILTER_TYPE_MINIMUM_ANISOTROPIC:
        case FILTER_TYPE_MAXIMUM_LINEAR:
        case FILTER_TYPE_MAXIMUM_ANISOTROPIC:
            return VK_SAMPLER_MIPMAP_MODE_LINEAR;

        default:
            UNEXPECTED("Only point and linear filter types are allowed for mipmap mode");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;
    }
}